

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day01b.cpp
# Opt level: O3

void day1b::run(void)

{
  int iVar1;
  ostream *poVar2;
  string input;
  char local_29;
  string local_28;
  
  read_file_abi_cxx11_(&local_28,"input/day1.txt");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"day1b ",6);
  iVar1 = calculate_distance(&local_28);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  local_29 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day1.txt");
		std::cout << "day1b ";
		std::cout << calculate_distance(input) << '\n';
		//std::cout << calculate_distance("R8, R4, R4, R8") << '\n';
	}